

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void __thiscall Database::Commit(Database *this)

{
  Database_Exception *this_00;
  Database_Result local_40;
  Database *local_10;
  Database *this_local;
  
  local_10 = this;
  if ((this->in_transaction & 1U) == 0) {
    this_00 = (Database_Exception *)__cxa_allocate_exception(0x10);
    Database_Exception::Database_Exception(this_00,"No transaction to commit");
    __cxa_throw(this_00,&Database_Exception::typeinfo,Database_Exception::~Database_Exception);
  }
  RawQuery(&local_40,this,"COMMIT",true);
  Database_Result::~Database_Result(&local_40);
  this->in_transaction = false;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->transaction_log);
  return;
}

Assistant:

void Database::Commit()
{
	if (!this->in_transaction)
		throw Database_Exception("No transaction to commit");

	this->RawQuery("COMMIT", true);
	this->in_transaction = false;
	this->transaction_log.clear();
}